

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O3

void __thiscall GlobOptBlockData::ReuseBlockData(GlobOptBlockData *this,GlobOptBlockData *fromData)

{
  GlobOpt *this_00;
  CapturedValues *this_01;
  ExprHashTable *pEVar1;
  BVSparse<Memory::JitArenaAllocator> *pBVar2;
  ValueSet *pVVar3;
  IntBoundCheckSet *pIVar4;
  StackLiteralInitFldDataMap *pSVar5;
  uint uVar6;
  bool bVar7;
  
  this_00 = fromData->globOpt;
  this->globOpt = this_00;
  pEVar1 = fromData->exprToValueMap;
  this->symToValueMap = fromData->symToValueMap;
  this->exprToValueMap = pEVar1;
  pBVar2 = fromData->liveArrayValues;
  this->liveFields = fromData->liveFields;
  this->liveArrayValues = pBVar2;
  pBVar2 = fromData->isTempSrc;
  this->maybeWrittenTypeSyms = fromData->maybeWrittenTypeSyms;
  this->isTempSrc = pBVar2;
  pBVar2 = fromData->liveInt32Syms;
  this->liveVarSyms = fromData->liveVarSyms;
  this->liveInt32Syms = pBVar2;
  pBVar2 = fromData->liveFloat64Syms;
  this->liveLossyInt32Syms = fromData->liveLossyInt32Syms;
  this->liveFloat64Syms = pBVar2;
  bVar7 = GlobOpt::TrackArgumentsObject(this_00);
  if (bVar7) {
    this->argObjSyms = fromData->argObjSyms;
  }
  pBVar2 = fromData->canStoreTempObjectSyms;
  this->maybeTempObjectSyms = fromData->maybeTempObjectSyms;
  this->canStoreTempObjectSyms = pBVar2;
  pVVar3 = fromData->valuesToKillOnCalls;
  this->curFunc = fromData->curFunc;
  this->valuesToKillOnCalls = pVVar3;
  pIVar4 = fromData->availableIntBoundChecks;
  this->inductionVariables = fromData->inductionVariables;
  this->availableIntBoundChecks = pIVar4;
  uVar6 = fromData->argOutCount;
  this->startCallCount = fromData->startCallCount;
  this->argOutCount = uVar6;
  this->totalOutParamCount = fromData->totalOutParamCount;
  this->inlinedArgOutSize = fromData->inlinedArgOutSize;
  this->hasCSECandidates = fromData->hasCSECandidates;
  pSVar5 = fromData->stackLiteralInitFldDataMap;
  this->callSequence = fromData->callSequence;
  this->stackLiteralInitFldDataMap = pSVar5;
  this_01 = fromData->capturedValues;
  pBVar2 = fromData->changedSyms;
  this->capturedValues = fromData->capturedValues;
  this->changedSyms = pBVar2;
  if (this_01 != (CapturedValues *)0x0) {
    CapturedValues::IncrementRefCount(this_01);
  }
  this->hasDataRef = fromData->hasDataRef;
  return;
}

Assistant:

void
GlobOptBlockData::ReuseBlockData(GlobOptBlockData *fromData)
{
    this->globOpt = fromData->globOpt;

    // Reuse dead map
    this->symToValueMap = fromData->symToValueMap;
    this->exprToValueMap = fromData->exprToValueMap;
    this->liveFields = fromData->liveFields;
    this->liveArrayValues = fromData->liveArrayValues;
    this->maybeWrittenTypeSyms = fromData->maybeWrittenTypeSyms;
    this->isTempSrc = fromData->isTempSrc;
    this->liveVarSyms = fromData->liveVarSyms;
    this->liveInt32Syms = fromData->liveInt32Syms;
    this->liveLossyInt32Syms = fromData->liveLossyInt32Syms;
    this->liveFloat64Syms = fromData->liveFloat64Syms;

    if (this->globOpt->TrackArgumentsObject())
    {
        this->argObjSyms = fromData->argObjSyms;
    }
    this->maybeTempObjectSyms = fromData->maybeTempObjectSyms;
    this->canStoreTempObjectSyms = fromData->canStoreTempObjectSyms;
    this->curFunc = fromData->curFunc;

    this->valuesToKillOnCalls = fromData->valuesToKillOnCalls;
    this->inductionVariables = fromData->inductionVariables;
    this->availableIntBoundChecks = fromData->availableIntBoundChecks;
    this->callSequence = fromData->callSequence;

    this->startCallCount = fromData->startCallCount;
    this->argOutCount = fromData->argOutCount;
    this->totalOutParamCount = fromData->totalOutParamCount;
    this->inlinedArgOutSize = fromData->inlinedArgOutSize;
    this->hasCSECandidates = fromData->hasCSECandidates;

    this->stackLiteralInitFldDataMap = fromData->stackLiteralInitFldDataMap;

    this->changedSyms = fromData->changedSyms;
    this->capturedValues = fromData->capturedValues;
    if (this->capturedValues)
    {
        this->capturedValues->IncrementRefCount();
    }

    this->OnDataReused(fromData);
}